

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::ResizeIfLoadIsOutOfRange(InnerMap *this,size_type new_size)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  ulong local_60;
  unsigned_long local_58;
  size_t local_50;
  size_type new_num_buckets;
  size_type hypothetical_size;
  size_type lg2_of_size_reduction_factor;
  size_type lo_cutoff;
  size_type hi_cutoff;
  size_type kMaxMapLoadTimes16;
  size_type new_size_local;
  InnerMap *this_local;
  
  hi_cutoff = 0xc;
  uVar2 = this->num_buckets_ * 0xc;
  lo_cutoff = uVar2 >> 4;
  lg2_of_size_reduction_factor = uVar2 >> 6;
  kMaxMapLoadTimes16 = new_size;
  new_size_local = (size_type)this;
  if (new_size < lo_cutoff) {
    bVar1 = false;
    if (new_size <= lg2_of_size_reduction_factor) {
      bVar1 = 8 < this->num_buckets_;
    }
    if (bVar1) {
      new_num_buckets = (new_size * 5 >> 2) + 1;
      for (hypothetical_size = 1; new_num_buckets << ((byte)hypothetical_size & 0x3f) < lo_cutoff;
          hypothetical_size = hypothetical_size + 1) {
      }
      local_58 = 8;
      local_60 = this->num_buckets_ >> ((byte)hypothetical_size & 0x3f);
      puVar4 = std::max<unsigned_long>(&local_58,&local_60);
      local_50 = *puVar4;
      if (local_50 != this->num_buckets_) {
        Resize(this,local_50);
        return true;
      }
    }
  }
  else {
    uVar2 = this->num_buckets_;
    sVar3 = max_size();
    if (uVar2 <= sVar3 >> 1) {
      Resize(this,this->num_buckets_ << 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool ResizeIfLoadIsOutOfRange(size_type new_size) {
      const size_type kMaxMapLoadTimes16 = 12;  // controls RAM vs CPU tradeoff
      const size_type hi_cutoff = num_buckets_ * kMaxMapLoadTimes16 / 16;
      const size_type lo_cutoff = hi_cutoff / 4;
      // We don't care how many elements are in trees.  If a lot are,
      // we may resize even though there are many empty buckets.  In
      // practice, this seems fine.
      if (GOOGLE_PREDICT_FALSE(new_size >= hi_cutoff)) {
        if (num_buckets_ <= max_size() / 2) {
          Resize(num_buckets_ * 2);
          return true;
        }
      } else if (GOOGLE_PREDICT_FALSE(new_size <= lo_cutoff &&
                               num_buckets_ > kMinTableSize)) {
        size_type lg2_of_size_reduction_factor = 1;
        // It's possible we want to shrink a lot here... size() could even be 0.
        // So, estimate how much to shrink by making sure we don't shrink so
        // much that we would need to grow the table after a few inserts.
        const size_type hypothetical_size = new_size * 5 / 4 + 1;
        while ((hypothetical_size << lg2_of_size_reduction_factor) <
               hi_cutoff) {
          ++lg2_of_size_reduction_factor;
        }
        size_type new_num_buckets = std::max<size_type>(
            kMinTableSize, num_buckets_ >> lg2_of_size_reduction_factor);
        if (new_num_buckets != num_buckets_) {
          Resize(new_num_buckets);
          return true;
        }
      }
      return false;
    }